

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int BuildMapBitdepth16To8(TIFFRGBAImage *img)

{
  uint8_t *puVar1;
  uint local_24;
  uint8_t *puStack_20;
  uint32_t n;
  uint8_t *m;
  TIFFRGBAImage *img_local;
  
  if (img->Bitdepth16To8 == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)_TIFFmallocExt(img->tif,0x10000);
    img->Bitdepth16To8 = puVar1;
    if (img->Bitdepth16To8 == (uint8_t *)0x0) {
      TIFFErrorExtR(img->tif,"BuildMapBitdepth16To8","Out of memory");
      img_local._4_4_ = 0;
    }
    else {
      puStack_20 = img->Bitdepth16To8;
      for (local_24 = 0; local_24 < 0x10000; local_24 = local_24 + 1) {
        *puStack_20 = (uint8_t)((ulong)(local_24 + 0x80) / 0x101);
        puStack_20 = puStack_20 + 1;
      }
      img_local._4_4_ = 1;
    }
    return img_local._4_4_;
  }
  __assert_fail("img->Bitdepth16To8 == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_getimage.c"
                ,0xc65,"int BuildMapBitdepth16To8(TIFFRGBAImage *)");
}

Assistant:

static int BuildMapBitdepth16To8(TIFFRGBAImage *img)
{
    static const char module[] = "BuildMapBitdepth16To8";
    uint8_t *m;
    uint32_t n;
    assert(img->Bitdepth16To8 == NULL);
    img->Bitdepth16To8 = _TIFFmallocExt(img->tif, 65536);
    if (img->Bitdepth16To8 == NULL)
    {
        TIFFErrorExtR(img->tif, module, "Out of memory");
        return (0);
    }
    m = img->Bitdepth16To8;
    for (n = 0; n < 65536; n++)
        *m++ = (uint8_t)((n + 128) / 257);
    return (1);
}